

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O3

pool_ptr<soul::Module> __thiscall
soul::Program::ProgramImpl::findModuleContainingFunction(ProgramImpl *this,Function *f)

{
  long *plVar1;
  long lVar2;
  pool_ref<soul::heart::Function> *ppVar3;
  long *plVar4;
  long lVar5;
  
  plVar4 = (long *)(f->parameters).numActive;
  plVar1 = (long *)(f->parameters).numAllocated;
  if (plVar4 == plVar1) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    do {
      lVar2 = *plVar4;
      ppVar3 = std::
               __find_if<soul::pool_ref<soul::heart::Function>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Function_const>>
                         (*(long *)(lVar2 + 0x130),
                          *(long *)(lVar2 + 0x130) + *(long *)(lVar2 + 0x138) * 8);
      if (ppVar3 != (pool_ref<soul::heart::Function> *)
                    (*(long *)(lVar2 + 0x138) * 8 + *(long *)(lVar2 + 0x130))) {
        lVar5 = *plVar4;
        break;
      }
      plVar4 = plVar4 + 1;
    } while (plVar4 != plVar1);
  }
  *(long *)this = lVar5;
  return (pool_ptr<soul::Module>)(Module *)this;
}

Assistant:

pool_ptr<Module> findModuleContainingFunction (const heart::Function& f) const
    {
        for (auto& m : modules)
            if (m->functions.contains (f))
                return m;

        return {};
    }